

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_DRAIN_MANA(effect_handler_context_t_conflict *context)

{
  _Bool _Var1;
  monster *mon_00;
  loc_conflict grid;
  bool bVar2;
  wchar_t local_9c;
  wchar_t local_90;
  wchar_t wStack_8c;
  loc_conflict decoy;
  monster *t_mon;
  monster *mon;
  char m_name [80];
  wchar_t local_1c;
  _Bool monster;
  wchar_t drain;
  effect_handler_context_t_conflict *context_local;
  
  local_9c = effect_calculate_value(context,false);
  bVar2 = (context->origin).what != SRC_TRAP;
  t_mon = (monster *)0x0;
  mon_00 = monster_target_monster(context);
  grid = (loc_conflict)cave_find_decoy(cave);
  context->ident = true;
  if (bVar2) {
    if ((context->origin).what != SRC_MONSTER) {
      __assert_fail("context->origin.what == SRC_MONSTER",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/effect-handler-general.c"
                    ,0x3e1,"_Bool effect_handler_DRAIN_MANA(effect_handler_context_t *)");
    }
    t_mon = (monster *)cave_monster(cave,(context->origin).which.monster);
    monster_desc((char *)&mon,0x50,t_mon,L'̔');
  }
  if (mon_00 == (monster *)0x0) {
    wStack_8c = grid.y;
    if ((wStack_8c == L'\0') || (local_90 = grid.x, local_90 == L'\0')) {
      if (player->csp == 0) {
        msg("The draining fails.");
        if (bVar2) {
          update_smart_learn(t_mon,player,L'\0',L'\x1d',L'\xffffffff');
        }
      }
      else {
        if (local_9c < player->csp) {
          player->csp = player->csp - (short)local_9c;
          local_1c = local_9c;
        }
        else {
          local_1c = (wchar_t)player->csp;
          player->csp = 0;
          player->csp_frac = 0;
        }
        if ((bVar2) && (t_mon->hp < t_mon->maxhp)) {
          t_mon->hp = t_mon->hp + (short)local_1c * 6;
          if (t_mon->maxhp < t_mon->hp) {
            t_mon->hp = t_mon->maxhp;
          }
          if (player->upkeep->health_who == t_mon) {
            player->upkeep->redraw = player->upkeep->redraw | 0x200;
          }
          _Var1 = monster_is_visible(t_mon);
          if (_Var1) {
            msg("%s appears healthier.",&mon);
          }
        }
        player->upkeep->redraw = player->upkeep->redraw | 0x80;
      }
    }
    else {
      square_destroy_decoy((chunk *)cave,grid);
    }
  }
  else {
    if (local_9c < L'\0') {
      local_9c = L'\0';
    }
    mon_inc_timed(mon_00,L'\a',local_9c,L'\0');
  }
  return true;
}

Assistant:

bool effect_handler_DRAIN_MANA(effect_handler_context_t *context)
{
	int drain = effect_calculate_value(context, false);
	bool monster = context->origin.what != SRC_TRAP;
	char m_name[80];
	struct monster *mon = NULL;
	struct monster *t_mon = monster_target_monster(context);
	struct loc decoy = cave_find_decoy(cave);

	context->ident = true;

	if (monster) {
		assert(context->origin.what == SRC_MONSTER);

		mon = cave_monster(cave, context->origin.which.monster);

		/* Get the monster name (or "it") */
		monster_desc(m_name, sizeof(m_name), mon, MDESC_STANDARD);
	}

	/* Target is another monster - disenchant it */
	if (t_mon) {
		mon_inc_timed(t_mon, MON_TMD_DISEN, MAX(drain, 0), 0);
		return true;
	}

	/* Target was a decoy - destroy it */
	if (decoy.y && decoy.x) {
		square_destroy_decoy(cave, decoy);
		return true;
	}

	/* The player has no mana */
	if (!player->csp) {
		msg("The draining fails.");
		if (monster) {
			update_smart_learn(mon, player, 0, PF_NO_MANA, -1);
		}
		return true;
	}

	/* Drain the given amount if the player has that much, or all of it */
	if (drain >= player->csp) {
		drain = player->csp;
		player->csp = 0;
		player->csp_frac = 0;
	} else {
		player->csp -= drain;
	}

	/* Heal the monster */
	if (monster) {
		if (mon->hp < mon->maxhp) {
			mon->hp += (6 * drain);
			if (mon->hp > mon->maxhp)
				mon->hp = mon->maxhp;

			/* Redraw (later) if needed */
			if (player->upkeep->health_who == mon)
				player->upkeep->redraw |= (PR_HEALTH);

			/* Special message */
			if (monster_is_visible(mon))
				msg("%s appears healthier.", m_name);
		}
	}

	/* Redraw mana */
	player->upkeep->redraw |= PR_MANA;

	return true;
}